

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_getCParams_internal
          (int compressionLevel,unsigned_long_long srcSizeHint,size_t dictSize,
          ZSTD_cParamMode_e mode)

{
  int iVar1;
  size_t in_RCX;
  unsigned_long_long in_RDX;
  int in_ESI;
  ZSTD_compressionParameters *in_RDI;
  ZSTD_cParamMode_e in_R8D;
  ZSTD_compressionParameters in_stack_00000000;
  int clampedCompressionLevel;
  ZSTD_compressionParameters cp;
  int row;
  U32 tableID;
  U64 rSize;
  ZSTD_cParamMode_e in_stack_ffffffffffffff84;
  size_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ZSTD_paramSwitch_e in_stack_ffffffffffffffe0;
  
  ZSTD_getCParamRowSize
            (CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
             ,in_stack_ffffffffffffff84);
  if ((in_ESI < 0) && (iVar1 = ZSTD_minCLevel(), in_ESI < iVar1)) {
    ZSTD_minCLevel();
  }
  ZSTD_adjustCParams_internal(in_stack_00000000,in_RDX,in_RCX,in_R8D,in_stack_ffffffffffffffe0);
  return in_RDI;
}

Assistant:

static ZSTD_compressionParameters ZSTD_getCParams_internal(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize, ZSTD_cParamMode_e mode)
{
    U64 const rSize = ZSTD_getCParamRowSize(srcSizeHint, dictSize, mode);
    U32 const tableID = (rSize <= 256 KB) + (rSize <= 128 KB) + (rSize <= 16 KB);
    int row;
    DEBUGLOG(5, "ZSTD_getCParams_internal (cLevel=%i)", compressionLevel);

    /* row */
    if (compressionLevel == 0) row = ZSTD_CLEVEL_DEFAULT;   /* 0 == default */
    else if (compressionLevel < 0) row = 0;   /* entry 0 is baseline for fast mode */
    else if (compressionLevel > ZSTD_MAX_CLEVEL) row = ZSTD_MAX_CLEVEL;
    else row = compressionLevel;

    {   ZSTD_compressionParameters cp = ZSTD_defaultCParameters[tableID][row];
        DEBUGLOG(5, "ZSTD_getCParams_internal selected tableID: %u row: %u strat: %u", tableID, row, (U32)cp.strategy);
        /* acceleration factor */
        if (compressionLevel < 0) {
            int const clampedCompressionLevel = MAX(ZSTD_minCLevel(), compressionLevel);
            cp.targetLength = (unsigned)(-clampedCompressionLevel);
        }
        /* refine parameters based on srcSize & dictSize */
        return ZSTD_adjustCParams_internal(cp, srcSizeHint, dictSize, mode, ZSTD_ps_auto);
    }
}